

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  aiAnimation *paVar1;
  aiScene *paVar2;
  aiAnimation *paVar3;
  long *plVar4;
  aiNodeAnim **ppaVar5;
  undefined1 *puVar6;
  ulong uVar7;
  aiAnimation **__dest;
  long *plVar8;
  pointer ppaVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer __src;
  uint uVar11;
  unsigned_long *puVar12;
  ulong uVar13;
  pointer ppaVar14;
  size_t __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  unsigned_long *local_4a8;
  iterator iStack_4a0;
  unsigned_long *local_498;
  aiScene *local_490;
  long *local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_480;
  long *local_478;
  ulong local_470;
  long local_468;
  long lStack_460;
  undefined1 *local_458;
  ulong local_450;
  undefined1 local_448 [16];
  string local_438 [32];
  
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p);
  }
  ppaVar9 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar14 != ppaVar9) {
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    local_490 = pScene;
    do {
      paVar1 = ppaVar9[(long)paVar10];
      if (paVar1->mNumChannels == 1) {
        local_4a8 = (unsigned_long *)0x0;
        iStack_4a0._M_current = (unsigned_long *)0x0;
        local_498 = (unsigned_long *)0x0;
        local_438[0]._M_dataplus._M_p = paVar10->_M_local_buf + 1;
        local_480 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p;
        if (local_438[0]._M_dataplus._M_p < (undefined1 *)((long)ppaVar14 - (long)ppaVar9 >> 3)) {
          do {
            paVar3 = ppaVar9[(long)local_438[0]._M_dataplus._M_p];
            if (paVar3->mNumChannels == 1) {
              if ((paVar3->mDuration == paVar1->mDuration) &&
                 (!NAN(paVar3->mDuration) && !NAN(paVar1->mDuration))) {
                if ((paVar3->mTicksPerSecond == paVar1->mTicksPerSecond) &&
                   (!NAN(paVar3->mTicksPerSecond) && !NAN(paVar1->mTicksPerSecond))) {
                  if (iStack_4a0._M_current == local_498) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_4a8,
                               iStack_4a0,(unsigned_long *)local_438);
                  }
                  else {
                    *iStack_4a0._M_current = (unsigned_long)local_438[0]._M_dataplus._M_p;
                    iStack_4a0._M_current = iStack_4a0._M_current + 1;
                  }
                }
              }
            }
            local_438[0]._M_dataplus._M_p = local_438[0]._M_dataplus._M_p + 1;
            ppaVar9 = (this->mAnims).
                      super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (local_438[0]._M_dataplus._M_p <
                   (undefined1 *)
                   ((long)(this->mAnims).
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppaVar9 >> 3));
          puVar12 = local_4a8;
          if (local_4a8 != iStack_4a0._M_current) {
            paVar3 = (aiAnimation *)operator_new(0x448);
            (paVar3->mName).length = 0;
            (paVar3->mName).data[0] = '\0';
            memset((paVar3->mName).data + 1,0x1b,0x3ff);
            paVar3->mDuration = -1.0;
            paVar3->mTicksPerSecond = 0.0;
            paVar3->mNumChannels = 0;
            paVar3->mChannels = (aiNodeAnim **)0x0;
            paVar3->mNumMeshChannels = 0;
            paVar3->mMeshChannels = (aiMeshAnim **)0x0;
            paVar3->mNumMorphMeshChannels = 0;
            paVar3->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
            local_458 = local_448;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"combinedAnim_","")
            ;
            plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_458,local_450,0,'\x01');
            local_478 = &local_468;
            plVar8 = plVar4 + 2;
            if ((long *)*plVar4 == plVar8) {
              local_468 = *plVar8;
              lStack_460 = plVar4[3];
            }
            else {
              local_468 = *plVar8;
              local_478 = (long *)*plVar4;
            }
            local_470 = plVar4[1];
            *plVar4 = (long)plVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            local_488 = local_478;
            __n = local_470 & 0xffffffff;
            if ((local_470 & 0xfffffc00) != 0) {
              __n = 0x3ff;
            }
            local_438[0]._M_dataplus._M_p._0_4_ = (ai_uint32)__n;
            memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_478,__n);
            *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + __n + 4) = 0;
            (paVar3->mName).length = (ai_uint32)__n;
            memcpy((paVar3->mName).data,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),__n);
            (paVar3->mName).data[__n] = '\0';
            if (local_488 != &local_468) {
              operator_delete(local_488);
            }
            if (local_458 != local_448) {
              operator_delete(local_458);
            }
            paVar3->mDuration = paVar1->mDuration;
            paVar3->mTicksPerSecond = paVar1->mTicksPerSecond;
            uVar11 = (int)((ulong)((long)iStack_4a0._M_current - (long)local_4a8) >> 3) + 1;
            paVar3->mNumChannels = uVar11;
            ppaVar5 = (aiNodeAnim **)operator_new__((ulong)uVar11 << 3);
            paVar3->mChannels = ppaVar5;
            *ppaVar5 = *paVar1->mChannels;
            *paVar1->mChannels = (aiNodeAnim *)0x0;
            aiAnimation::~aiAnimation(paVar1);
            operator_delete(paVar1);
            (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start[(long)paVar10] = paVar3;
            if (iStack_4a0._M_current != local_4a8) {
              uVar13 = 0;
              do {
                paVar1 = (this->mAnims).
                         super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                         super__Vector_impl_data._M_start[local_4a8[uVar13]];
                paVar3->mChannels[uVar13 + 1] = *paVar1->mChannels;
                uVar13 = uVar13 + 1;
                *paVar1->mChannels = (aiNodeAnim *)0x0;
                aiAnimation::~aiAnimation(paVar1);
                operator_delete(paVar1);
              } while (uVar13 < (ulong)((long)iStack_4a0._M_current - (long)local_4a8 >> 3));
            }
            puVar12 = local_4a8;
            if (local_4a8 != iStack_4a0._M_current) {
              ppaVar9 = (this->mAnims).
                        super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              do {
                ppaVar14 = (this->mAnims).
                           super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
                           .super__Vector_impl_data._M_start;
                __src = ppaVar14 + iStack_4a0._M_current[-1] + 1;
                if (__src != ppaVar9) {
                  memmove(ppaVar14 + iStack_4a0._M_current[-1],__src,(long)ppaVar9 - (long)__src);
                  ppaVar9 = (this->mAnims).
                            super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  puVar12 = local_4a8;
                }
                ppaVar9 = ppaVar9 + -1;
                (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                _M_impl.super__Vector_impl_data._M_finish = ppaVar9;
                iStack_4a0._M_current = iStack_4a0._M_current + -1;
              } while (puVar12 != iStack_4a0._M_current);
            }
          }
          if (puVar12 != (unsigned_long *)0x0) {
            operator_delete(puVar12);
          }
        }
        ppaVar9 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        paVar10 = local_480;
      }
      else {
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar10->_M_local_buf + 1);
      }
      paVar2 = local_490;
      puVar6 = (undefined1 *)((long)ppaVar14 - (long)ppaVar9 >> 3);
    } while (paVar10 < puVar6);
    if (ppaVar9 != ppaVar14) {
      local_490->mNumAnimations = (uint)puVar6;
      uVar7 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = 0xffffffffffffffff;
      if (-1 < (long)uVar7) {
        uVar13 = uVar7;
      }
      __dest = (aiAnimation **)operator_new__(uVar13);
      paVar2->mAnimations = __dest;
      ppaVar9 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppaVar14 - (long)ppaVar9 == 0) {
        return;
      }
      memmove(__dest,ppaVar9,(long)ppaVar14 - (long)ppaVar9);
    }
  }
  if (ppaVar14 != ppaVar9) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar9;
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for( size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];
        if( templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
                    collectedAnimIndices.push_back(b);
            }

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}